

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O1

WebPInfoStatus
ParseLossySegmentHeader(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  int quantizer [4];
  int filter_strength [4];
  ulong local_68;
  ulong uStack_60;
  uint local_4c;
  ulong local_48;
  ulong uStack_40;
  
  uVar6 = *bit_pos;
  *bit_pos = uVar6 + 1;
  if (data_size <= uVar6 >> 3) {
    if (webp_info->show_diagnosis != 0) {
      ParseLossySegmentHeader_cold_1();
      return WEBP_INFO_TRUNCATED_DATA;
    }
    return WEBP_INFO_TRUNCATED_DATA;
  }
  bVar4 = -((char)(data[uVar6 >> 3] << ((byte)uVar6 & 7)) >> 7);
  printf("  Use segment:      %d\n",(ulong)bVar4);
  if (bVar4 == 0) {
    return WEBP_INFO_OK;
  }
  uVar2 = *bit_pos;
  uVar6 = uVar2 + 1;
  *bit_pos = uVar6;
  if (uVar2 >> 3 < data_size) {
    uVar5 = (uint)((byte)(data[uVar2 >> 3] << ((byte)uVar2 & 7)) >> 7);
    *bit_pos = uVar2 + 2;
    if (uVar6 >> 3 < data_size) {
      bVar4 = -((char)(data[uVar6 >> 3] << ((byte)uVar6 & 7)) >> 7);
      local_4c = 0;
      printf("  Update map:       %d\n  Update data:      %d\n",(ulong)uVar5,(ulong)bVar4);
      if (bVar4 != 0) {
        local_68 = 0;
        uStack_60 = 0;
        local_48 = 0;
        uStack_40 = 0;
        uVar6 = *bit_pos;
        *bit_pos = uVar6 + 1;
        if (data_size <= uVar6 >> 3) {
LAB_00104f81:
          if (webp_info->show_diagnosis == 0) {
            return WEBP_INFO_TRUNCATED_DATA;
          }
          ParseLossySegmentHeader_cold_4();
          return WEBP_INFO_TRUNCATED_DATA;
        }
        local_4c = (uint)((byte)(data[uVar6 >> 3] << ((byte)uVar6 & 7)) >> 7);
        lVar8 = 0;
        printf("  Absolute delta:   %d\n",(ulong)local_4c);
        do {
          uVar6 = *bit_pos;
          *bit_pos = uVar6 + 1;
          if ((data_size <= uVar6 >> 3) ||
             (((char)(data[uVar6 >> 3] << ((byte)uVar6 & 7)) < '\0' &&
              (iVar1 = GetSignedBits(data,data_size,7,(int *)((long)&local_68 + lVar8),bit_pos),
              iVar1 == 0)))) goto LAB_00104f81;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
        lVar8 = 0;
        do {
          uVar6 = *bit_pos;
          *bit_pos = uVar6 + 1;
          if ((data_size <= uVar6 >> 3) ||
             (((char)(data[uVar6 >> 3] << ((byte)uVar6 & 7)) < '\0' &&
              (iVar1 = GetSignedBits(data,data_size,6,(int *)((long)&local_48 + lVar8),bit_pos),
              iVar1 == 0)))) goto LAB_00104f81;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
        printf("  Quantizer:        %d %d %d %d\n",local_68 & 0xffffffff,local_68 >> 0x20,
               uStack_60 & 0xffffffff,uStack_60 >> 0x20);
        printf("  Filter strength:  %d %d %d %d\n",local_48 & 0xffffffff,local_48 >> 0x20,
               uStack_40 & 0xffffffff,uStack_40 >> 0x20);
      }
      if (uVar5 != 0) {
        local_68 = 0xff000000ff;
        uStack_60 = CONCAT44(uStack_60._4_4_,0xff);
        uVar6 = 0;
        bVar9 = false;
        uVar2 = *bit_pos;
        do {
          uVar3 = uVar2 + 1;
          *bit_pos = uVar3;
          if (data_size <= uVar2 >> 3) {
            if (webp_info->show_diagnosis != 0) {
              ParseLossySegmentHeader_cold_5();
            }
            goto LAB_00104fa3;
          }
          if ((char)(data[uVar2 >> 3] << ((byte)uVar2 & 7)) < '\0') {
            *(undefined4 *)((long)&local_68 + uVar6 * 4) = 0;
            lVar8 = -8;
            uVar2 = uVar3;
            do {
              uVar3 = uVar2 + 1;
              *bit_pos = uVar3;
              uVar7 = uVar2 >> 3;
              if (data_size <= uVar7) goto LAB_00104f9d;
              *(uint *)((long)&local_68 + uVar6 * 4) =
                   (uint)((byte)(data[uVar7] << ((byte)uVar2 & 7)) >> 7) +
                   *(int *)((long)&local_68 + uVar6 * 4) * 2;
              lVar8 = lVar8 + 1;
              uVar2 = uVar3;
            } while (lVar8 != 0);
            if (data_size <= uVar7) {
LAB_00104f9d:
              if (webp_info->show_diagnosis != 0) {
                ParseLossySegmentHeader_cold_6();
              }
              goto LAB_00104fa3;
            }
          }
          bVar9 = 1 < uVar6;
          uVar6 = uVar6 + 1;
          uVar2 = uVar3;
        } while (uVar6 != 3);
        printf("  Prob segment:     %d %d %d\n",local_68 & 0xffffffff,local_68 >> 0x20,
               uStack_60 & 0xffffffff);
LAB_00104fa3:
        if (!bVar9) {
          return WEBP_INFO_TRUNCATED_DATA;
        }
      }
      return WEBP_INFO_OK;
    }
    if (webp_info->show_diagnosis != 0) {
      ParseLossySegmentHeader_cold_3();
    }
  }
  else if (webp_info->show_diagnosis != 0) {
    ParseLossySegmentHeader_cold_2();
  }
  return WEBP_INFO_TRUNCATED_DATA;
}

Assistant:

static WebPInfoStatus ParseLossySegmentHeader(const WebPInfo* const webp_info,
                                              const uint8_t* const data,
                                              size_t data_size,
                                              uint64_t* const bit_pos) {
  int use_segment;
  GET_BITS(use_segment, 1);
  printf("  Use segment:      %d\n", use_segment);
  if (use_segment) {
    int update_map, update_data;
    GET_BITS(update_map, 1);
    GET_BITS(update_data, 1);
    printf("  Update map:       %d\n"
           "  Update data:      %d\n",
           update_map, update_data);
    if (update_data) {
      int i, a_delta;
      int quantizer[4] = {0, 0, 0, 0};
      int filter_strength[4] = {0, 0, 0, 0};
      GET_BITS(a_delta, 1);
      printf("  Absolute delta:   %d\n", a_delta);
      for (i = 0; i < 4; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_SIGNED_BITS(quantizer[i], 7);
      }
      for (i = 0; i < 4; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_SIGNED_BITS(filter_strength[i], 6);
      }
      printf("  Quantizer:        %d %d %d %d\n", quantizer[0], quantizer[1],
             quantizer[2], quantizer[3]);
      printf("  Filter strength:  %d %d %d %d\n", filter_strength[0],
             filter_strength[1], filter_strength[2], filter_strength[3]);
    }
    if (update_map) {
      int i;
      int prob_segment[3] = {255, 255, 255};
      for (i = 0; i < 3; ++i) {
        int bit;
        GET_BITS(bit, 1);
        if (bit) GET_BITS(prob_segment[i], 8);
      }
      printf("  Prob segment:     %d %d %d\n",
             prob_segment[0], prob_segment[1], prob_segment[2]);
    }
  }
  return WEBP_INFO_OK;
}